

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::DataFlowAnalysis::LSPVisitor<slang::analysis::DataFlowAnalysis>::handle
          (LSPVisitor<slang::analysis::DataFlowAnalysis> *this,ElementSelectExpression *expr)

{
  DataFlowAnalysis *visitor;
  bool bVar1;
  ElementSelectExpression *pEVar2;
  
  bVar1 = ast::ElementSelectExpression::isConstantSelect
                    (expr,&(this->owner->
                           super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                           ).super_FlowAnalysisBase.evalContext);
  if (bVar1) {
    pEVar2 = expr;
    if (this->currentLSP != (Expression *)0x0) goto LAB_0051360d;
  }
  else {
    pEVar2 = (ElementSelectExpression *)0x0;
  }
  this->currentLSP = &pEVar2->super_Expression;
LAB_0051360d:
  ast::Expression::visit<slang::analysis::DataFlowAnalysis&>(expr->value_,this->owner);
  visitor = this->owner;
  bVar1 = visitor->isLValue;
  visitor->isLValue = false;
  ast::Expression::visit<slang::analysis::DataFlowAnalysis&>(expr->selector_,visitor);
  visitor->isLValue = bVar1;
  return;
}

Assistant:

void handle(const ElementSelectExpression& expr) {
            if (expr.isConstantSelect(owner.getEvalContext())) {
                if (!currentLSP)
                    currentLSP = &expr;
            }
            else {
                currentLSP = nullptr;
            }

            owner.visit(expr.value());

            [[maybe_unused]] auto guard = owner.saveLValueFlag();
            owner.visit(expr.selector());
        }